

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::PutDeferred
          (SscWriterGeneric *this,VariableBase *variable,void *data)

{
  pointer *__lhs;
  int iVar1;
  pointer pvVar2;
  size_t sVar3;
  undefined8 *puVar4;
  SscWriterGeneric *pSVar5;
  VariableBase *pVVar6;
  __type _Var7;
  bool bVar8;
  size_t sVar9;
  ulong __n;
  Dims *b_00;
  bool bVar10;
  BlockInfo *b;
  pointer pBVar11;
  allocator local_124;
  allocator local_123;
  allocator local_122;
  allocator local_121;
  undefined8 *local_120;
  SscWriterGeneric *local_118;
  VariableBase *local_110;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  string local_98;
  string local_78;
  string local_58;
  pointer local_38;
  
  local_120 = (undefined8 *)data;
  local_118 = this;
  local_110 = variable;
  if (*(int *)(variable + 0x28) == 0xe) {
    iVar1 = (this->super_SscWriterBase).m_StreamRank;
    pvVar2 = (this->m_GlobalWritePattern).
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = *(pointer *)
                ((long)&pvVar2[iVar1].
                        super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                        ._M_impl.super__Vector_impl_data + 8);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(variable + 8);
    bVar10 = false;
    for (pBVar11 = pvVar2[iVar1].
                   super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start; pVVar6 = local_110, pSVar5 = local_118
        , puVar4 = local_120, pBVar11 != local_38; pBVar11 = pBVar11 + 1) {
      _Var7 = std::operator==(&pBVar11->name,local_e8);
      puVar4 = local_120;
      if (_Var7) {
        __n = local_120[1];
        if (pBVar11->bufferCount < __n) {
          std::__cxx11::string::string((string *)&local_108,"Engine",(allocator *)&vStart);
          std::__cxx11::string::string((string *)&local_58,"SSCWriter",(allocator *)&vCount);
          std::__cxx11::string::string((string *)&local_78,"PutDeferredCommon",(allocator *)&vShape)
          ;
          std::__cxx11::string::string
                    ((string *)&local_98,"SSC only accepts fixed length string variables",&local_124
                    );
          helper::Throw<std::invalid_argument>(&local_108,&local_58,&local_78,&local_98,-1);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_108);
          __n = puVar4[1];
        }
        memcpy((local_118->super_SscWriterBase).m_Buffer.m_Buffer + pBVar11->bufferStart,
               (void *)*puVar4,__n);
        bVar10 = true;
      }
    }
    if (bVar10) {
      return;
    }
    if ((((local_118->super_SscWriterBase).m_CurrentStep != 0) &&
        (local_118->m_WriterDefinitionsLocked != false)) &&
       (local_118->m_ReaderSelectionsLocked != false)) {
      std::__cxx11::string::string((string *)&local_108,"Engine",(allocator *)&vStart);
      std::__cxx11::string::string((string *)&local_58,"SSCWriter",(allocator *)&vCount);
      std::__cxx11::string::string((string *)&local_78,"PutDeferredCommon",(allocator *)&vShape);
      std::__cxx11::string::string
                ((string *)&local_98,"IO pattern changed after locking",&local_124);
      helper::Throw<std::invalid_argument>(&local_108,&local_58,&local_78,&local_98,-1);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_108);
      return;
    }
    std::
    vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
    ::emplace_back<>((local_118->m_GlobalWritePattern).
                     super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (local_118->super_SscWriterBase).m_StreamRank);
    pBVar11 = *(pointer *)
               ((long)&(pSVar5->m_GlobalWritePattern).
                       super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(pSVar5->super_SscWriterBase).m_StreamRank].
                       super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                       ._M_impl.super__Vector_impl_data + 8);
    std::__cxx11::string::_M_assign((string *)(pBVar11 + -1));
    pBVar11[-1].type = String;
    pBVar11[-1].shapeId = *(ShapeID *)(pVVar6 + 0x40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar11[-1].shape,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pVVar6 + 0x58));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar11[-1].start,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pVVar6 + 0x70));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar11[-1].count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pVVar6 + 0x88));
    sVar9 = (pSVar5->super_SscWriterBase).m_Buffer.m_Size;
    pBVar11[-1].bufferStart = sVar9;
    sVar3 = puVar4[1];
    pBVar11[-1].bufferCount = sVar3;
    Buffer::resize(&(pSVar5->super_SscWriterBase).m_Buffer,sVar3 + sVar9);
    memcpy((pSVar5->super_SscWriterBase).m_Buffer.m_Buffer + pBVar11[-1].bufferStart,(void *)*puVar4
           ,puVar4[1]);
    std::vector<char,_std::allocator<char>_>::resize(&pBVar11[-1].value,puVar4[1]);
    memcpy(pBVar11[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,(void *)*puVar4,puVar4[1]);
    return;
  }
  if (((*(int *)(variable + 0x40) == 4) || (*(int *)(variable + 0x40) == 1)) &&
     ((this->super_SscWriterBase).m_WriterRank != 0)) {
    return;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vStart,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vCount,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vShape,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
  if (*(int *)((this->super_SscWriterBase).m_IO + 0x58) != 0) {
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (vShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  iVar1 = (this->super_SscWriterBase).m_StreamRank;
  pvVar2 = (this->m_GlobalWritePattern).
           super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar11 = *(pointer *)
             ((long)&pvVar2[iVar1].
                     super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                     ._M_impl.super__Vector_impl_data + 8);
  b_00 = (Dims *)(*(long *)&pvVar2[iVar1].
                            super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                            ._M_impl.super__Vector_impl_data + 0x70);
  bVar10 = false;
  while (pSVar5 = local_118,
        __lhs = &b_00[-5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish, (pointer)__lhs != pBVar11) {
    _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(variable + 8));
    if (((_Var7) && (bVar8 = AreSameDims(&vStart,b_00), bVar8)) &&
       ((bVar8 = AreSameDims(&vCount,b_00 + 1), bVar8 &&
        (bVar8 = AreSameDims(&vShape,b_00 + -1), bVar8)))) {
      memcpy((local_118->super_SscWriterBase).m_Buffer.m_Buffer +
             (long)b_00[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_start,local_120,
             (size_t)b_00[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
      bVar10 = true;
    }
    b_00 = b_00 + 0xb;
  }
  if (!bVar10) {
    if ((((local_118->super_SscWriterBase).m_CurrentStep == 0) ||
        (local_118->m_WriterDefinitionsLocked == false)) ||
       (local_118->m_ReaderSelectionsLocked == false)) {
      std::
      vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
      ::emplace_back<>((local_118->m_GlobalWritePattern).
                       super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (local_118->super_SscWriterBase).m_StreamRank);
      pBVar11 = *(pointer *)
                 ((long)&(pSVar5->m_GlobalWritePattern).
                         super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(pSVar5->super_SscWriterBase).m_StreamRank].
                         super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                         ._M_impl.super__Vector_impl_data + 8);
      std::__cxx11::string::_M_assign((string *)(pBVar11 + -1));
      pVVar6 = local_110;
      puVar4 = local_120;
      pBVar11[-1].type = *(DataType *)(local_110 + 0x28);
      pBVar11[-1].shapeId = *(ShapeID *)(local_110 + 0x40);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar11[-1].shape,&vShape);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar11[-1].start,&vStart);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar11[-1].count,&vCount);
      sVar9 = *(size_t *)(pVVar6 + 0x30);
      pBVar11[-1].elementSize = sVar9;
      pBVar11[-1].bufferStart = (pSVar5->super_SscWriterBase).m_Buffer.m_Size;
      sVar9 = TotalDataSize(&pBVar11[-1].count,sVar9,&pBVar11[-1].shapeId);
      pBVar11[-1].bufferCount = sVar9;
      Buffer::resize(&(pSVar5->super_SscWriterBase).m_Buffer,sVar9 + pBVar11[-1].bufferStart);
      memcpy((pSVar5->super_SscWriterBase).m_Buffer.m_Buffer + pBVar11[-1].bufferStart,puVar4,
             pBVar11[-1].bufferCount);
      if ((pBVar11[-1].shapeId == LocalValue) || (pBVar11[-1].shapeId == GlobalValue)) {
        std::vector<char,_std::allocator<char>_>::resize
                  (&pBVar11[-1].value,*(size_type *)(pVVar6 + 0x30));
        memcpy(pBVar11[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,puVar4,pBVar11[-1].bufferCount);
      }
      if (*(int *)(pVVar6 + 0x28) != 0x10) goto LAB_001481ee;
      adios2::core::StructDefinition::StructName_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&pBVar11[-1].structDef,(string *)&local_108);
    }
    else {
      std::__cxx11::string::string((string *)&local_108,"Engine",&local_124);
      std::__cxx11::string::string((string *)&local_58,"SSCWriter",&local_121);
      std::__cxx11::string::string((string *)&local_78,"PutDeferredCommon",&local_122);
      std::__cxx11::string::string
                ((string *)&local_98,"IO pattern changed after locking",&local_123);
      helper::Throw<std::invalid_argument>(&local_108,&local_58,&local_78,&local_98,-1);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_108);
  }
LAB_001481ee:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vCount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vStart.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void SscWriterGeneric::PutDeferred(VariableBase &variable, const void *data)
{
    if (variable.m_Type == DataType::String)
    {
        const auto dataString = reinterpret_cast<const std::string *>(data);
        bool found = false;
        for (const auto &b : m_GlobalWritePattern[m_StreamRank])
        {
            if (b.name == variable.m_Name)
            {
                if (b.bufferCount < dataString->size())
                {
                    helper::Throw<std::invalid_argument>(
                        "Engine", "SSCWriter", "PutDeferredCommon",
                        "SSC only accepts fixed length string variables");
                }
                std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(),
                            dataString->size());
                found = true;
            }
        }

        if (!found)
        {
            if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
                m_ReaderSelectionsLocked == false)
            {
                m_GlobalWritePattern[m_StreamRank].emplace_back();
                auto &b = m_GlobalWritePattern[m_StreamRank].back();
                b.name = variable.m_Name;
                b.type = DataType::String;
                b.shapeId = variable.m_ShapeID;
                b.shape = variable.m_Shape;
                b.start = variable.m_Start;
                b.count = variable.m_Count;
                b.bufferStart = m_Buffer.size();
                b.bufferCount = dataString->size();
                m_Buffer.resize(b.bufferStart + b.bufferCount);
                std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(),
                            dataString->size());
                b.value.resize(dataString->size());
                std::memcpy(b.value.data(), dataString->data(), dataString->size());
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SSCWriter", "PutDeferredCommon",
                                                     "IO pattern changed after locking");
            }
        }
        return;
    }

    if ((variable.m_ShapeID == ShapeID::GlobalValue || variable.m_ShapeID == ShapeID::LocalValue ||
         variable.m_Type == DataType::String) &&
        m_WriterRank != 0)
    {
        return;
    }

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
    }

    bool found = false;
    for (const auto &b : m_GlobalWritePattern[m_StreamRank])
    {
        if (b.name == variable.m_Name && ssc::AreSameDims(vStart, b.start) &&
            ssc::AreSameDims(vCount, b.count) && ssc::AreSameDims(vShape, b.shape))
        {
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            found = true;
        }
    }

    if (!found)
    {
        if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
            m_ReaderSelectionsLocked == false)
        {
            m_GlobalWritePattern[m_StreamRank].emplace_back();
            auto &b = m_GlobalWritePattern[m_StreamRank].back();
            b.name = variable.m_Name;
            b.type = variable.m_Type;
            b.shapeId = variable.m_ShapeID;
            b.shape = vShape;
            b.start = vStart;
            b.count = vCount;
            b.elementSize = variable.m_ElementSize;
            b.bufferStart = m_Buffer.size();
            b.bufferCount = ssc::TotalDataSize(b.count, b.elementSize, b.shapeId);
            m_Buffer.resize(b.bufferStart + b.bufferCount);
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
            {
                b.value.resize(variable.m_ElementSize);
                std::memcpy(b.value.data(), data, b.bufferCount);
            }
            if (variable.m_Type == DataType::Struct)
            {
                b.structDef = reinterpret_cast<VariableStruct *>(&variable)
                                  ->m_WriteStructDefinition->StructName();
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>("Engine", "SSCWriter", "PutDeferredCommon",
                                                 "IO pattern changed after locking");
        }
    }
}